

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void markold(global_State *g,GCObject *from,GCObject *to)

{
  GCObject *local_28;
  GCObject *p;
  GCObject *to_local;
  GCObject *from_local;
  global_State *g_local;
  
  local_28 = from;
  do {
    if (local_28 == to) {
      return;
    }
    if ((local_28->marked & 7) == 3) {
      if ((local_28->marked & 0x18) != 0) {
        __assert_fail("!(((p)->marked) & (((1<<(3)) | (1<<(4)))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x523,"void markold(global_State *, GCObject *, GCObject *)");
      }
      if ((local_28->marked & 7) != 3) {
        __assert_fail("((p)->marked & 7) == (3)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x524,"void markold(global_State *, GCObject *, GCObject *)");
      }
      local_28->marked = local_28->marked ^ 7;
      if ((local_28->marked & 0x20) != 0) {
        reallymarkobject(g,local_28);
      }
    }
    local_28 = local_28->next;
  } while( true );
}

Assistant:

static void markold (global_State *g, GCObject *from, GCObject *to) {
  GCObject *p;
  for (p = from; p != to; p = p->next) {
    if (getage(p) == G_OLD1) {
      lua_assert(!iswhite(p));
      changeage(p, G_OLD1, G_OLD);  /* now they are old */
      if (isblack(p))
        reallymarkobject(g, p);
    }
  }
}